

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_14c9a7e::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  bool bVar3;
  ValueType VVar4;
  ArrayIndex AVar5;
  int __n;
  ArrayIndex AVar6;
  string *name;
  string *psVar7;
  string *psVar8;
  Value *this_00;
  Value *pVVar9;
  runtime_error *prVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  char *pcVar12;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *value;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  Args path;
  string_view value_01;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  Args path_00;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  Args path_01;
  string_view value_02;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  Args path_02;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  Args path_03;
  string_view value_03;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  Args path_04;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  string_view value_04;
  string_view value_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_13;
  string_view sVar13;
  const_iterator cVar14;
  ValueConstIterator VVar15;
  Args args;
  cmAlphaNum sizeStr;
  undefined1 local_a0 [8];
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Value json;
  string_view local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  string_view local_40;
  
  this = status->Makefile;
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar13._M_str = "missing out-var argument";
  sVar13._M_len = 0x18;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,sVar13);
  if ((args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .Begin._M_current !=
       args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .End._M_current) &&
     (__y._M_str = "ERROR_VARIABLE", __y._M_len = 0xe,
     __x._M_str = ((args.
                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .Begin._M_current)->_M_dataplus)._M_p,
     __x._M_len = (args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current)->_M_string_length, bVar3 = std::operator==(__x,__y), bVar3)) {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&args,(string_view)(ZEXT816(0x80b2f9) << 0x40));
    error._M_str = "missing error-var argument";
    error._M_len = 0x1a;
    psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error);
    value_00._M_str = "NOTFOUND";
    value_00._M_len = 8;
    cmMakefile::AddDefinition(this,psVar7,value_00);
  }
  error_00._M_str = "missing mode argument";
  error_00._M_len = 0x15;
  psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_00);
  __y_00._M_str = "GET";
  __y_00._M_len = 3;
  __x_00._M_str = (psVar7->_M_dataplus)._M_p;
  __x_00._M_len = psVar7->_M_string_length;
  bVar3 = std::operator!=(__x_00,__y_00);
  if (((((bVar3) &&
        (__y_01._M_str = "TYPE", __y_01._M_len = 4, __x_01._M_str = (psVar7->_M_dataplus)._M_p,
        __x_01._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_01,__y_01), bVar3)) &&
       (__y_02._M_str = "MEMBER", __y_02._M_len = 6, __x_02._M_str = (psVar7->_M_dataplus)._M_p,
       __x_02._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_02,__y_02), bVar3)) &&
      ((__y_03._M_str = "LENGTH", __y_03._M_len = 6, __x_03._M_str = (psVar7->_M_dataplus)._M_p,
       __x_03._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_03,__y_03), bVar3 &&
       (__y_04._M_str = "REMOVE", __y_04._M_len = 6, __x_04._M_str = (psVar7->_M_dataplus)._M_p,
       __x_04._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_04,__y_04), bVar3))))
     && ((__y_05._M_str = "SET", __y_05._M_len = 3, __x_05._M_str = (psVar7->_M_dataplus)._M_p,
         __x_05._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_05,__y_05), bVar3 &&
         (__y_06._M_str = "EQUAL", __y_06._M_len = 5, __x_06._M_str = (psVar7->_M_dataplus)._M_p,
         __x_06._M_len = psVar7->_M_string_length, bVar3 = std::operator!=(__x_06,__y_06), bVar3))))
  {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
    json.value_.int_ = 0x15;
    json._8_8_ = anon_var_dwarf_14d1087;
    local_a0 = (undefined1  [8])0x41;
    local_98 = "\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL";
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              ((string *)&sizeStr,(static_string_view *)&json,psVar7,(static_string_view *)local_a0)
    ;
    std::runtime_error::runtime_error(prVar10,(string *)&sizeStr);
    *(undefined ***)prVar10 = &PTR__runtime_error_00aa2948;
    prVar10[0x20] = (runtime_error)0x0;
    __cxa_throw(prVar10,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  error_01._M_str = "missing json string argument";
  error_01._M_len = 0x1c;
  psVar8 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_01);
  ReadJson(&json,psVar8);
  __y_07._M_str = "GET";
  __y_07._M_len = 3;
  _Var11._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7f0748;
  __x_07._M_str = (psVar7->_M_dataplus)._M_p;
  __x_07._M_len = psVar7->_M_string_length;
  bVar3 = std::operator==(__x_07,__y_07);
  if (bVar3) {
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var11._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         args.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    this_00 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                          (Value *)args.
                                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .Begin._M_current,path);
    bVar3 = Json::Value::isObject(this_00);
    pVVar9 = extraout_RDX;
    if ((bVar3) || (bVar3 = Json::Value::isArray(this_00), pVVar9 = extraout_RDX_00, bVar3)) {
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&sizeStr,(_anonymous_namespace_ *)this_00,pVVar9);
      value_01._M_str = (char *)sizeStr.RValueString_;
      value_01._M_len = sizeStr.View_._M_len;
      cmMakefile::AddDefinition(this,name,value_01);
    }
    else {
      bVar3 = Json::Value::isBool(this_00);
      if (bVar3) {
        bVar3 = Json::Value::asBool(this_00);
        cmMakefile::AddDefinitionBool(this,name,bVar3);
        goto LAB_003f6bf5;
      }
      Json::Value::asString_abi_cxx11_((String *)&sizeStr,this_00);
      value_03._M_str = (char *)sizeStr.RValueString_;
      value_03._M_len = sizeStr.View_._M_len;
      cmMakefile::AddDefinition(this,name,value_03);
    }
  }
  else {
    __y_08._M_str = "TYPE";
    __y_08._M_len = 4;
    _Var11._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7f85ee;
    __x_08._M_str = (psVar7->_M_dataplus)._M_p;
    __x_08._M_len = psVar7->_M_string_length;
    bVar3 = std::operator==(__x_08,__y_08);
    if (bVar3) {
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var11._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_00);
      VVar4 = Json::Value::type(pVVar9);
      sVar13 = JsonTypeToString(VVar4);
      cmMakefile::AddDefinition(this,name,sVar13);
      goto LAB_003f6bf5;
    }
    __y_09._M_str = "MEMBER";
    __y_09._M_len = 6;
    pcVar12 = "MEMBER";
    __x_09._M_str = (psVar7->_M_dataplus)._M_p;
    __x_09._M_len = psVar7->_M_string_length;
    bVar3 = std::operator==(__x_09,__y_09);
    if (bVar3) {
      error_02._M_str = "missing member index";
      error_02._M_len = 0x14;
      psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_02);
      _Var1 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      _Var11 = args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12
      ;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_01);
      bVar3 = Json::Value::isObject(pVVar9);
      if (!bVar3) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_a0 = (undefined1  [8])0x3e;
        local_98 = "MEMBER needs to be called with an element of type OBJECT, got ";
        VVar4 = Json::Value::type(pVVar9);
        local_58 = JsonTypeToString(VVar4);
        cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&sizeStr,(static_string_view *)local_a0,&local_58);
        std::runtime_error::runtime_error(prVar10,(string *)&sizeStr);
        *(undefined ***)prVar10 = &PTR__runtime_error_00aa2948;
        *(undefined4 *)(prVar10 + 0x10) =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current._0_4_;
        *(undefined4 *)(prVar10 + 0x14) =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current._4_4_;
        *(undefined4 *)(prVar10 + 0x18) =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current._0_4_;
        *(undefined4 *)(prVar10 + 0x1c) =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current._4_4_;
        prVar10[0x20] = (runtime_error)0x1;
        __cxa_throw(prVar10,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      sizeStr.View_._M_len = (size_t)(_Var1._M_current + 1);
      sizeStr.RValueString_ = _Var11._M_current;
      sizeStr.View_._M_str._0_1_ = 1;
      AVar5 = Json::Value::size(pVVar9);
      __n = ParseIndex(psVar7,(optional<(anonymous_namespace)::Args> *)&sizeStr,AVar5);
      cVar14 = Json::Value::begin(pVVar9);
      VVar15.super_ValueIteratorBase._9_7_ = 0;
      VVar15.super_ValueIteratorBase.current_._M_node =
           (_Base_ptr)(long)cVar14.super_ValueIteratorBase._0_9_;
      VVar15.super_ValueIteratorBase.isNull_ =
           (bool)(char)(cVar14.super_ValueIteratorBase._0_9_ >> 0x40);
      VVar15 = std::next<Json::ValueConstIterator>(VVar15,__n);
      local_a0 = (undefined1  [8])VVar15.super_ValueIteratorBase.current_._M_node;
      local_98 = (char *)CONCAT71(local_98._1_7_,VVar15.super_ValueIteratorBase.isNull_);
      Json::ValueIteratorBase::name_abi_cxx11_((String *)&sizeStr,(ValueIteratorBase *)local_a0);
      value_02._M_str = (char *)sizeStr.RValueString_;
      value_02._M_len = sizeStr.View_._M_len;
      cmMakefile::AddDefinition(this,name,value_02);
    }
    else {
      __y_10._M_str = "LENGTH";
      __y_10._M_len = 6;
      pcVar12 = "LENGTH";
      __x_10._M_str = (psVar7->_M_dataplus)._M_p;
      __x_10._M_len = psVar7->_M_string_length;
      bVar3 = std::operator==(__x_10,__y_10);
      if (bVar3) {
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        pVVar9 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                             (Value *)args.
                                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .Begin._M_current,path_02);
        bVar3 = Json::Value::isArray(pVVar9);
        if ((!bVar3) && (bVar3 = Json::Value::isObject(pVVar9), !bVar3)) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_a0 = (undefined1  [8])0x47;
          local_98 = "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar4 = Json::Value::type(pVVar9);
          local_58 = JsonTypeToString(VVar4);
          cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&sizeStr,(static_string_view *)local_a0,&local_58);
          std::runtime_error::runtime_error(prVar10,(string *)&sizeStr);
          *(undefined ***)prVar10 = &PTR__runtime_error_00aa2948;
          *(undefined4 *)(prVar10 + 0x10) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._0_4_;
          *(undefined4 *)(prVar10 + 0x14) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._4_4_;
          *(undefined4 *)(prVar10 + 0x18) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._0_4_;
          *(undefined4 *)(prVar10 + 0x1c) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._4_4_;
          prVar10[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar10,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar5 = Json::Value::size(pVVar9);
        cmAlphaNum::cmAlphaNum(&sizeStr,AVar5);
        sVar13 = cmAlphaNum::View(&sizeStr);
        cmMakefile::AddDefinition(this,name,sVar13);
        goto LAB_003f6bf5;
      }
      __y_11._M_str = "REMOVE";
      __y_11._M_len = 6;
      _Var11._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ea6f7;
      __x_11._M_str = (psVar7->_M_dataplus)._M_p;
      __x_11._M_len = psVar7->_M_string_length;
      bVar3 = std::operator==(__x_11,__y_11);
      if (!bVar3) {
        __y_12._M_str = "SET";
        __y_12._M_len = 3;
        _Var11._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82fcc4;
        __x_12._M_str = (psVar7->_M_dataplus)._M_p;
        __x_12._M_len = psVar7->_M_string_length;
        bVar3 = std::operator==(__x_12,__y_12);
        if (bVar3) {
          error_04._M_str = "missing new value remove";
          error_04._M_len = 0x18;
          psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_04);
          error_05._M_str = "missing member name to add";
          error_05._M_len = 0x1a;
          psVar8 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_05);
          _Var1 = args.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End;
          local_48._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current;
          path_04.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current = _Var11._M_current;
          path_04.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current;
          pVVar9 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                               (Value *)args.
                                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .Begin._M_current,path_04);
          ReadJson((Value *)&sizeStr,psVar7);
          bVar3 = Json::Value::isObject(pVVar9);
          if (bVar3) {
            pVVar9 = Json::Value::operator[](pVVar9,psVar8);
            Json::Value::operator=(pVVar9,(Value *)&sizeStr);
            pVVar9 = extraout_RDX_01;
          }
          else {
            bVar3 = Json::Value::isArray(pVVar9);
            if (!bVar3) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
              local_58._M_str =
                   "SET needs to be called with an element of type OBJECT or ARRAY, got ";
              local_58._M_len = 0x44;
              VVar4 = Json::Value::type(pVVar9);
              local_40 = JsonTypeToString(VVar4);
              cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)local_a0,(static_string_view *)&local_58,&local_40);
              std::runtime_error::runtime_error(prVar10,(string *)local_a0);
              *(undefined ***)prVar10 = &PTR__runtime_error_00aa2948;
              prVar10[0x20] = (runtime_error)0x0;
              __cxa_throw(prVar10,&(anonymous_namespace)::json_error::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            local_98 = (char *)(_Var1._M_current + 1);
            local_a0 = (undefined1  [8])local_48._M_current;
            local_90._M_local_buf[0] = true;
            AVar6 = ParseIndex(psVar8,(optional<(anonymous_namespace)::Args> *)local_a0,0xffffffff);
            bVar3 = Json::Value::isValidIndex(pVVar9,AVar6);
            if (bVar3) {
              pVVar9 = Json::Value::operator[](pVVar9,AVar6);
              Json::Value::operator=(pVVar9,(Value *)&sizeStr);
              pVVar9 = extraout_RDX_02;
            }
            else {
              Json::Value::append(pVVar9,(Value *)&sizeStr);
              pVVar9 = extraout_RDX_03;
            }
          }
          (anonymous_namespace)::WriteJson_abi_cxx11_
                    ((string *)local_a0,(_anonymous_namespace_ *)&json,pVVar9);
          value_05._M_str = (char *)local_a0;
          value_05._M_len = (size_t)local_98;
          cmMakefile::AddDefinition(this,name,value_05);
          std::__cxx11::string::~string((string *)local_a0);
        }
        else {
          __y_13._M_str = "EQUAL";
          __y_13._M_len = 5;
          __x_13._M_str = (psVar7->_M_dataplus)._M_p;
          __x_13._M_len = psVar7->_M_string_length;
          bVar3 = std::operator==(__x_13,__y_13);
          if (!bVar3) goto LAB_003f6bf5;
          error_06._M_str = "missing second json string argument";
          error_06._M_len = 0x23;
          psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_06);
          ReadJson((Value *)&sizeStr,psVar7);
          bVar3 = Json::Value::operator==(&json,(Value *)&sizeStr);
          cmMakefile::AddDefinitionBool(this,name,bVar3);
        }
        Json::Value::~Value((Value *)&sizeStr);
        goto LAB_003f6bf5;
      }
      error_03._M_str = "missing member or index to remove";
      error_03._M_len = 0x21;
      psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_03);
      _Var2 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      _Var1 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var11._M_current;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_14c9a7e *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_03);
      bVar3 = Json::Value::isArray(pVVar9);
      if (bVar3) {
        sizeStr.View_._M_len = (size_t)(_Var2._M_current + 1);
        sizeStr.RValueString_ = _Var1._M_current;
        sizeStr.View_._M_str._0_1_ = 1;
        AVar5 = Json::Value::size(pVVar9);
        AVar6 = ParseIndex(psVar7,(optional<(anonymous_namespace)::Args> *)&sizeStr,AVar5);
        Json::Value::Value((Value *)&sizeStr,nullValue);
        Json::Value::removeIndex(pVVar9,AVar6,(Value *)&sizeStr);
      }
      else {
        bVar3 = Json::Value::isObject(pVVar9);
        if (!bVar3) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_a0 = (undefined1  [8])0x47;
          local_98 = "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar4 = Json::Value::type(pVVar9);
          local_58 = JsonTypeToString(VVar4);
          cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&sizeStr,(static_string_view *)local_a0,&local_58);
          std::runtime_error::runtime_error(prVar10,(string *)&sizeStr);
          *(undefined ***)prVar10 = &PTR__runtime_error_00aa2948;
          *(undefined4 *)(prVar10 + 0x10) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._0_4_;
          *(undefined4 *)(prVar10 + 0x14) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._4_4_;
          *(undefined4 *)(prVar10 + 0x18) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._0_4_;
          *(undefined4 *)(prVar10 + 0x1c) =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._4_4_;
          prVar10[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar10,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)&sizeStr,nullValue);
        Json::Value::removeMember(pVVar9,psVar7,(Value *)&sizeStr);
      }
      Json::Value::~Value((Value *)&sizeStr);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&sizeStr,(_anonymous_namespace_ *)&json,value);
      value_04._M_str = (char *)sizeStr.RValueString_;
      value_04._M_len = sizeStr.View_._M_len;
      cmMakefile::AddDefinition(this,name,value_04);
    }
  }
  std::__cxx11::string::~string((string *)&sizeStr);
LAB_003f6bf5:
  Json::Value::~Value(&json);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        cmStrCat("got an invalid mode '"_s, mode,
                 "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
                 " EQUAL"_s));
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error(
          cmStrCat("MEMBER needs to be called with an element of "
                   "type OBJECT, got "_s,
                   JsonTypeToString(value.type())),
          args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error(cmStrCat("LENGTH needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error(cmStrCat("REMOVE needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error(cmStrCat("SET needs to be called with an "
                                  "element of type OBJECT or ARRAY, got "_s,
                                  JsonTypeToString(value.type())));
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmStrCat(errorPath, "-NOTFOUND"_s));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmStrCat("sub-command JSON "_s, e.what(), "."_s));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}